

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<long_double>_>::Subst_Backward
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *B)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  long lVar4;
  long lVar5;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_120;
  long local_110;
  Fad<long_double> *local_108;
  Fad<long_double> *local_100;
  Fad<long_double> sum;
  Fad<long_double> pivot;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  lVar1 = (B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar1 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_110 = CONCAT44(extraout_var_00,iVar2);
    while (0 < local_110) {
      lVar1 = local_110 + -1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&pivot,this,lVar1);
      for (lVar5 = 0; lVar5 < (B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
          lVar5 = lVar5 + 1) {
        sum.val_ = (longdouble)0;
        sum.dx_.num_elts = 0;
        sum.dx_.ptr_to_data = (longdouble *)0x0;
        sum.defaultVal._0_8_ = 0;
        sum.defaultVal._8_2_ = 0;
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
        lVar4 = CONCAT44(extraout_var_01,iVar2);
        while (local_110 < lVar4) {
          lVar4 = lVar4 + -1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_68,this,lVar1,lVar4);
          (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_98,B,lVar4,lVar5);
          local_120.fadexpr_.left_ = &local_68;
          local_120.fadexpr_.right_ = &local_98;
          Fad<long_double>::operator+=(&sum,&local_120);
          Fad<long_double>::~Fad(&local_98);
          Fad<long_double>::~Fad(&local_68);
        }
        (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(&local_98,B,lVar1,lVar5);
        local_100 = &sum;
        local_120.fadexpr_.left_ = (Fad<long_double> *)&local_108;
        local_120.fadexpr_.right_ = &pivot;
        local_108 = &local_98;
        Fad<long_double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,Fad<long_double>>>,Fad<long_double>>>
                  (&local_68,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
                    *)&local_120);
        (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(B,lVar1,lVar5,&local_68);
        Fad<long_double>::~Fad(&local_68);
        Fad<long_double>::~Fad(&local_98);
        Fad<long_double>::~Fad(&sum);
      }
      Fad<long_double>::~Fad(&pivot);
      local_110 = lVar1;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}